

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.h
# Opt level: O2

Element * __thiscall Assimp::FBX::Scope::FindElementCaseInsensitive(Scope *this,string *elementName)

{
  char *s2;
  int iVar1;
  _Base_ptr p_Var2;
  
  s2 = (elementName->_M_dataplus)._M_p;
  p_Var2 = (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->elements)._M_t._M_impl.super__Rb_tree_header) {
      return (Element *)0x0;
    }
    iVar1 = ASSIMP_strincmp(*(char **)(p_Var2 + 1),s2,0x400);
    if (iVar1 == 0) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return *(Element **)(p_Var2 + 2);
}

Assistant:

const Element* FindElementCaseInsensitive(const std::string& elementName) const {
		const char* elementNameCStr = elementName.c_str();
		for (auto element = elements.begin(); element != elements.end(); ++element)
		{
			if (!ASSIMP_strincmp(element->first.c_str(), elementNameCStr, MAXLEN)) {
				return element->second;
			}
		}
		return NULL;
	}